

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O0

void __thiscall arangodb::velocypack::ArrayIterator::next(ArrayIterator *this)

{
  bool bVar1;
  ValueLength VVar2;
  ArrayIterator *in_RDI;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffe0;
  Slice local_10 [2];
  
  bVar1 = valid(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    in_RDI->_position = in_RDI->_position + 1;
    Slice::Slice(local_10,in_RDI->_current);
    VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
                      (in_stack_ffffffffffffffe0);
    in_RDI->_current = in_RDI->_current + VVar2;
  }
  return;
}

Assistant:

void next() noexcept {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      return;
    }
    ++_position;
    VELOCYPACK_ASSERT(_current != nullptr);
    _current += Slice(_current).byteSize();
  }